

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

u64 u64Rev(u64 w)

{
  u64 w_local;
  
  return w << 0x38 | (w & 0xff00) << 0x28 | (w & 0xff0000) << 0x18 | (w & 0xff000000) << 8 |
         w >> 8 & 0xff000000 | w >> 0x18 & 0xff0000 | w >> 0x28 & 0xff00 | w >> 0x38;
}

Assistant:

u64 u64Rev(u64 w)
{
	return w << 56 | (w & 0xFF00) << 40 | (w & 0xFF0000) << 24 |
		(w & 0xFF000000) << 8 | (w >> 8 & 0xFF000000) |
		(w >> 24 & 0xFF0000) | (w >> 40 & 0xFF00) | w >> 56;
}